

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O1

void __thiscall
ExampleNLFeeder::
WriteDense2Sparse<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,double[2]>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,double (*vec) [2])

{
  undefined1 auVar1 [16];
  int i;
  ulong uVar2;
  SparseVectorWriter<int,_double> gvw;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *local_28;
  char *local_20;
  
  auVar1._8_8_ = -(ulong)((*vec)[1] != 0.0);
  auVar1._0_8_ = -(ulong)((*vec)[0] != 0.0);
  movmskpd((int)vec,auVar1);
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8,(size_t)gw);
  uVar2 = 0;
  do {
    if (((*vec)[uVar2] != 0.0) || (NAN((*vec)[uVar2]))) {
      local_20 = local_20 + -1;
      mp::TextFormatter::apr
                (&local_28->super_FormatterType,&local_28->nm,"%d %g\n",uVar2 & 0xffffffff);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 == 1);
  return;
}

Assistant:

void WriteDense2Sparse(GradWriterFactory& gw, const DenseVec& vec) {
    auto gvw = gw.MakeVectorWriter(CountNNZ(vec));
    WriteDense2Sparse_Pure(gvw, vec);
  }